

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

int init_path(void)

{
  int iVar1;
  size_t sVar2;
  int local_28;
  int l;
  int ret;
  char *pl;
  char *p;
  
  _l = getenv(machine->include_env);
  pl = _l;
  if (_l == (char *)0x0) {
    p._4_4_ = 2;
  }
  else {
    while (_l != (char *)0x0) {
      _l = strchr(pl,0x3a);
      if (_l == (char *)0x0) {
        sVar2 = strlen(pl);
        local_28 = (int)sVar2;
      }
      else {
        local_28 = (int)_l - (int)pl;
      }
      local_28 = local_28 + 1;
      if (local_28 < 2) {
        pl = pl + 1;
      }
      else {
        iVar1 = add_path(pl,local_28);
        if (iVar1 == 0) {
          return 0;
        }
        for (; *pl == ':'; pl = pl + 1) {
        }
        pl = pl + local_28;
      }
    }
    p._4_4_ = 1;
  }
  return p._4_4_;
}

Assistant:

int
init_path(void)
{
	char *p,*pl;
	int	ret, l;

	/* Get env variable holding PCE path*/
	p = getenv(machine->include_env);

	if (p == NULL)
		return 2;

	l  = 0;
	pl = p;
	while(pl != NULL)
	{
		
		/* Jump to next separator */
		pl = strchr(p, ENV_PATH_SEPARATOR);

		/* Compute new substring size */
		if(pl == NULL)
			l = strlen(p) + 1;
		else
			l = pl - p + 1;
			
		/* Might be empty, jump to next char */
		if(l <= 1)
		{
			++p;
			continue;
		}

		/* Add path */
		ret = add_path(p, l);
		if(!ret)
			return 0;

		/* Eat remaining separators */
		while (*p == ENV_PATH_SEPARATOR) ++p;
		
		p += l;
	}
	
	return 1;
}